

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void __thiscall NJamSpell::TTokenizer::TTokenizer(TTokenizer *this)

{
  locale *plVar1;
  TTokenizer *this_local;
  
  this->_vptr_TTokenizer = (_func_int **)&PTR_Dump_0015f9f8;
  std::unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  ::unordered_set(&this->Alphabet);
  plVar1 = (locale *)std::locale::classic();
  std::locale::locale(&this->Locale,plVar1);
  return;
}

Assistant:

TTokenizer::TTokenizer()
    : Locale(std::locale::classic())
{
}